

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderDiscardCase::init(ShaderDiscardCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Texture2D *tex2D;
  reference pvVar2;
  TextureBinding local_a0;
  Sampler local_58;
  
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  if ((this->m_flags & 1) != 0) {
    tex2D = glu::Texture2D::create
                      ((this->super_ShaderRenderCase).m_renderCtx,
                       (this->super_ShaderRenderCase).m_ctxInfo,
                       ((this->super_ShaderRenderCase).super_TestCase.super_TestNode.m_testCtx)->
                       m_curArchive,"data/brick.png");
    this->m_brickTexture = tex2D;
    local_58.wrapS = CLAMP_TO_EDGE;
    local_58.wrapT = CLAMP_TO_EDGE;
    local_58.wrapR = CLAMP_TO_EDGE;
    local_58.minFilter = LINEAR;
    local_58.magFilter = LINEAR;
    local_58.lodThreshold = 0.0;
    local_58.normalizedCoords = true;
    local_58.depthStencilMode = MODE_DEPTH;
    local_58.compare = COMPAREMODE_NONE;
    local_58.compareChannel = 0;
    local_58.borderColor.v.uData[0]._0_1_ = 0;
    local_58.borderColor.v._1_7_ = 0;
    local_58.borderColor.v.uData[2]._0_1_ = 0;
    local_58._45_8_ = 0;
    deqp::gls::TextureBinding::TextureBinding(&local_a0,tex2D,&local_58);
    pvVar2 = std::vector<deqp::gls::TextureBinding,_std::allocator<deqp::gls::TextureBinding>_>::
             emplace_back<deqp::gls::TextureBinding>
                       (&(this->super_ShaderRenderCase).m_textures,&local_a0);
    iVar1 = (int)pvVar2;
  }
  return iVar1;
}

Assistant:

void ShaderDiscardCase::init (void)
{
	try
	{
		gls::ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (m_flags & FLAG_REQUIRES_DYNAMIC_LOOPS)
		{
			const bool isSupported = m_isVertexCase ? m_ctxInfo.isVertexDynamicLoopSupported() : m_ctxInfo.isFragmentDynamicLoopSupported();
			if (!isSupported)
				throw tcu::NotSupportedError("Dynamic loops not supported");
		}

		throw;
	}

	if (m_flags & FLAG_USES_TEXTURES)
	{
		m_brickTexture = glu::Texture2D::create(m_renderCtx, m_ctxInfo, m_testCtx.getArchive(), "data/brick.png");
		m_textures.push_back(TextureBinding(m_brickTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
																		 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
	}
}